

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OverlayStack.cpp
# Opt level: O3

void __thiscall cursespp::OverlayStack::Remove(OverlayStack *this,ILayoutPtr *layout)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __normal_iterator<std::shared_ptr<cursespp::ILayout>_*,_std::vector<std::shared_ptr<cursespp::ILayout>,_std::allocator<std::shared_ptr<cursespp::ILayout>_>_>_>
  __position;
  long *plVar2;
  
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<cursespp::ILayout>*,std::vector<std::shared_ptr<cursespp::ILayout>,std::allocator<std::shared_ptr<cursespp::ILayout>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<cursespp::ILayout>const>>
                         ((this->stack).
                          super__Vector_base<std::shared_ptr<cursespp::ILayout>,_std::allocator<std::shared_ptr<cursespp::ILayout>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->stack).
                          super__Vector_base<std::shared_ptr<cursespp::ILayout>,_std::allocator<std::shared_ptr<cursespp::ILayout>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,layout);
  if (__position._M_current !=
      (this->stack).
      super__Vector_base<std::shared_ptr<cursespp::ILayout>,_std::allocator<std::shared_ptr<cursespp::ILayout>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    peVar1 = ((__position._M_current)->
             super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_00 = ((__position._M_current)->
              super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    if (peVar1 != (element_type *)0x0) {
      plVar2 = (long *)__dynamic_cast(peVar1,&ILayout::typeinfo,&IOverlay::typeinfo,
                                      0xfffffffffffffffe);
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 0x10))(plVar2,0);
      }
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    std::
    vector<std::shared_ptr<cursespp::ILayout>,_std::allocator<std::shared_ptr<cursespp::ILayout>_>_>
    ::_M_erase(&this->stack,(iterator)__position._M_current);
    return;
  }
  return;
}

Assistant:

void OverlayStack::Remove(ILayoutPtr layout) {
    auto it = std::find(
        this->stack.begin(),
        this->stack.end(), layout);

    if (it != this->stack.end()) {
        setOverlayStack(*it, nullptr);
        this->stack.erase(it);
    }
}